

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringencode.cc
# Opt level: O0

size_t rtc::unescape(char *buffer,size_t buflen,char *source,size_t srclen,char escape)

{
  ostream *poVar1;
  ulong uVar2;
  char local_1d9;
  char *pcStack_1d8;
  char ch;
  size_t bufpos;
  size_t srcpos;
  FatalMessage local_1b0;
  FatalMessageVoidify local_32;
  char local_31;
  size_t sStack_30;
  char escape_local;
  size_t srclen_local;
  char *source_local;
  size_t buflen_local;
  char *buffer_local;
  
  if (buffer != (char *)0x0) {
    if (buflen == 0) {
      buffer_local = (char *)0x0;
    }
    else {
      bufpos = 0;
      pcStack_1d8 = (char *)0x0;
      while (bufpos < srclen && pcStack_1d8 + 1 < buflen) {
        uVar2 = bufpos + 1;
        local_1d9 = source[bufpos];
        if ((local_1d9 == escape) && (uVar2 < srclen)) {
          local_1d9 = source[uVar2];
          uVar2 = bufpos + 2;
        }
        bufpos = uVar2;
        buffer[(long)pcStack_1d8] = local_1d9;
        pcStack_1d8 = pcStack_1d8 + 1;
      }
      buffer[(long)pcStack_1d8] = '\0';
      buffer_local = pcStack_1d8;
    }
    return (size_t)buffer_local;
  }
  local_31 = escape;
  sStack_30 = srclen;
  srclen_local = (size_t)source;
  source_local = (char *)buflen;
  buflen_local = (size_t)buffer;
  FatalMessageVoidify::FatalMessageVoidify(&local_32);
  FatalMessage::FatalMessage
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/stringencode.cc"
             ,0x33);
  poVar1 = FatalMessage::stream(&local_1b0);
  poVar1 = std::operator<<(poVar1,"Check failed: buffer");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"# ");
  FatalMessageVoidify::operator&(&local_32,poVar1);
  FatalMessage::~FatalMessage(&local_1b0);
}

Assistant:

size_t unescape(char * buffer, size_t buflen,
                const char * source, size_t srclen,
                char escape) {
  RTC_DCHECK(buffer);  // TODO(grunell): estimate output size
  if (buflen <= 0)
    return 0;

  size_t srcpos = 0, bufpos = 0;
  while ((srcpos < srclen) && (bufpos + 1 < buflen)) {
    char ch = source[srcpos++];
    if ((ch == escape) && (srcpos < srclen)) {
      ch = source[srcpos++];
    }
    buffer[bufpos++] = ch;
  }
  buffer[bufpos] = '\0';
  return bufpos;
}